

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection_push.c
# Opt level: O1

ssize_t mpt_connection_push(mpt_connection *con,size_t len,void *src)

{
  uint8_t *puVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  ssize_t sVar6;
  long lVar7;
  ulong len_00;
  mpt_stream *stream;
  ssize_t unaff_R15;
  ssize_t sVar8;
  uint8_t buf [64];
  undefined1 auStack_78 [72];
  
  if ((con->out).sock._id < 0) {
    stream = (mpt_stream *)(con->out).buf._buf;
    if (stream == (mpt_stream *)0x0) {
      return -1;
    }
  }
  else {
    stream = (mpt_stream *)0x0;
  }
  if ((((con->out).state & 0x10) != 0) || (bVar2 = (con->out)._idlen, bVar2 == 0))
  goto LAB_001058ef;
  if (bVar2 < 0x41) {
    iVar4 = mpt_message_id2buf(con->cid,auStack_78);
    if (iVar4 < 0) {
      sVar8 = (ssize_t)iVar4;
      goto LAB_001058c8;
    }
    len_00 = (ulong)(con->out)._idlen;
    sVar8 = unaff_R15;
    if (stream == (mpt_stream *)0x0) {
      sVar8 = mpt_outdata_push(&con->out,len_00,auStack_78);
      if (sVar8 < 0) {
        if (con->cid != 0) {
LAB_001059c5:
          lVar7 = mpt_command_get(&con->_wait);
          if (lVar7 != 0) {
            bVar3 = false;
            (**(code **)(lVar7 + 8))(*(undefined8 *)(lVar7 + 0x10),0);
            goto LAB_001058e6;
          }
        }
        goto LAB_001058c8;
      }
      bVar3 = true;
      sVar8 = unaff_R15;
    }
    else {
      sVar6 = mpt_stream_push(stream,len_00,auStack_78);
      bVar3 = true;
      if (-1 < sVar6) {
        if (sVar6 < (long)(ulong)(con->out)._idlen) {
          bVar3 = false;
          mpt_stream_push(stream,1,(void *)0x0);
          sVar8 = -0x11;
          if (con->cid != 0) goto LAB_001059c5;
        }
        else {
          puVar1 = &(con->out).state;
          *puVar1 = *puVar1 | 0x10;
        }
      }
    }
  }
  else {
    sVar8 = -2;
LAB_001058c8:
    bVar3 = false;
  }
LAB_001058e6:
  if (!bVar3) {
    return sVar8;
  }
LAB_001058ef:
  if (stream == (mpt_stream *)0x0) {
    sVar8 = mpt_outdata_push(&con->out,len,src);
    if ((sVar8 < 0) && (((con->out).state & 0x10) != 0)) {
      mpt_outdata_push(&con->out,1,(void *)0x0);
    }
  }
  else {
    sVar8 = mpt_stream_push(stream,len,src);
    if (sVar8 < 0) {
      uVar5 = mpt_stream_flags(&stream->_info);
      if ((uVar5 & 4) != 0) {
        mpt_stream_push(stream,1,(void *)0x0);
      }
      puVar1 = &(con->out).state;
      *puVar1 = *puVar1 & 0xef;
    }
    else {
      bVar2 = (con->out).state;
      if (len == 0) {
        (con->out).state = bVar2 & 0xef;
        mpt_stream_flush(stream);
        con->cid = 0;
      }
      else {
        (con->out).state = bVar2 | 0x10;
      }
    }
  }
  if (((sVar8 < 0) && (con->cid != 0)) && (lVar7 = mpt_command_get(&con->_wait), lVar7 != 0)) {
    (**(code **)(lVar7 + 8))(*(undefined8 *)(lVar7 + 0x10),0);
  }
  return sVar8;
}

Assistant:

extern ssize_t mpt_connection_push(MPT_STRUCT(connection) *con, size_t len, const void *src)
{
	MPT_STRUCT(stream) *srm;
	ssize_t ret;
	
	/* determine active backend */
	if (MPT_socket_active(&con->out.sock)) {
		srm = 0;
	}
	else if (!(srm = (void *) con->out.buf._buf)) {
		return MPT_ERROR(BadArgument);
	}
	/* new message start */
	if (!(con->out.state & MPT_OUTFLAG(Active))
	    && con->out._idlen) {
		uint8_t buf[64];
		
		/* create normalized ID */
		if (sizeof(buf) < con->out._idlen) {
			return MPT_ERROR(BadValue);
		}
		if ((ret = mpt_message_id2buf(con->cid, buf, con->out._idlen)) < 0) {
			return ret;
		}
		/* use stream backend */
		if (srm) {
			ret = mpt_stream_push(srm, con->out._idlen, buf);
			if (ret >= 0) {
				/* force atomic id push */
				if (ret < con->out._idlen) {
					mpt_stream_push(srm, 1, 0);
					if (con->cid) {
						deregisterCommand(&con->_wait, con->cid);
					}
					return MPT_ERROR(MissingBuffer);
				} else {
					con->out.state |= MPT_OUTFLAG(Active);
				}
			}
		}
		/* use socket backend (has atomic guarantee for ID setup) */
		else if ((ret = mpt_outdata_push(&con->out, con->out._idlen, buf)) < 0) {
			if (con->cid) {
				deregisterCommand(&con->_wait, con->cid);
			}
			return ret;
		}
	}
	/* regular message payload */
	if (srm) {
		if ((ret = mpt_stream_push(srm, len, src)) < 0) {
			/* push operation failed */
			if (mpt_stream_flags(&srm->_info) & MPT_STREAMFLAG(MesgActive)) {
				mpt_stream_push(srm, 1, 0);
			}
			con->out.state &= ~MPT_OUTFLAG(Active);
		}
		/* message completed */
		else if (!len) {
			con->out.state &= ~MPT_OUTFLAG(Active);
			mpt_stream_flush(srm);
			con->cid = 0;
		} else {
			con->out.state |= MPT_OUTFLAG(Active);
		}
	}
	else if ((ret = mpt_outdata_push(&con->out, len, src)) < 0) {
		if (con->out.state & MPT_OUTFLAG(Active)) {
			mpt_outdata_push(&con->out, 1, 0);
		}
	}
	if (ret < 0 && con->cid) {
		/* clear pending reply */
		deregisterCommand(&con->_wait, con->cid);
	}
	return ret;
}